

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

UBool icu_63::anon_unknown_0::mungeCharName(char *dst,char *src,int32_t dstCapacity)

{
  char cVar1;
  char *pcVar2;
  int local_28;
  char ch;
  int32_t j;
  int32_t dstCapacity_local;
  char *src_local;
  char *dst_local;
  
  local_28 = 0;
  _j = src;
  while( true ) {
    do {
      pcVar2 = _j + 1;
      cVar1 = *_j;
      if (cVar1 == '\0') {
        if ((0 < local_28) && (dst[local_28 + -1] == ' ')) {
          local_28 = local_28 + -1;
        }
        dst[local_28] = '\0';
        return '\x01';
      }
      _j = pcVar2;
    } while ((cVar1 == ' ') && ((local_28 == 0 || ((0 < local_28 && (dst[local_28 + -1] == ' '))))))
    ;
    if (dstCapacity + -1 <= local_28) break;
    dst[local_28] = cVar1;
    local_28 = local_28 + 1;
  }
  return '\0';
}

Assistant:

static UBool mungeCharName(char* dst, const char* src, int32_t dstCapacity) {
    /* Note: we use ' ' in compiler code page */
    int32_t j = 0;
    char ch;
    --dstCapacity; /* make room for term. zero */
    while ((ch = *src++) != 0) {
        if (ch == ' ' && (j==0 || (j>0 && dst[j-1]==' '))) {
            continue;
        }
        if (j >= dstCapacity) return FALSE;
        dst[j++] = ch;
    }
    if (j > 0 && dst[j-1] == ' ') --j;
    dst[j] = 0;
    return TRUE;
}